

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O3

void xml_print_ns(lyout *out,lyd_node *node,int options)

{
  lyd_node **pplVar1;
  LYS_NODE LVar2;
  lys_node *plVar3;
  char *pcVar4;
  mlist *pmVar5;
  mlist *pmVar6;
  lyd_node *plVar7;
  int iVar8;
  lys_module *plVar9;
  lyd_node *plVar10;
  lyd_attr *plVar11;
  mlist *local_40;
  lyd_node *local_38;
  
  local_40 = (mlist *)0x0;
  if (out == (lyout *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_xml.c"
                  ,0x48,"void xml_print_ns(struct lyout *, const struct lyd_node *, int)");
  }
  local_38 = (lyd_node *)CONCAT44(local_38._4_4_,options);
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_xml.c"
                  ,0x49,"void xml_print_ns(struct lyout *, const struct lyd_node *, int)");
  }
  for (plVar11 = node->attr; plVar11 != (lyd_attr *)0x0; plVar11 = plVar11->next) {
    plVar3 = node->schema;
    iVar8 = strcmp(plVar3->name,"filter");
    if (iVar8 == 0) {
      pcVar4 = plVar3->module->name;
      iVar8 = strcmp(pcVar4,"ietf-netconf");
      if ((iVar8 != 0) && (iVar8 = strcmp(pcVar4,"notifications"), iVar8 != 0)) goto LAB_00194c1b;
    }
    else {
LAB_00194c1b:
      plVar9 = lys_main_module(plVar11->annotation->module);
      iVar8 = modlist_add(&local_40,plVar9);
      pmVar6 = local_40;
      if (iVar8 != 0) goto joined_r0x00194e4c;
    }
  }
  plVar3 = node->schema;
  LVar2 = plVar3->nodetype;
  pmVar6 = local_40;
  if ((int)LVar2 < 0x10) {
    if (LVar2 != LYS_CONTAINER) {
      if ((((LVar2 == LYS_LEAF) || (LVar2 == LYS_LEAFLIST)) && (((ulong)local_38 & 0xc0) != 0)) &&
         (((node->field_0x9 & 1) != 0 &&
          (plVar9 = ly_ctx_get_module(plVar3->module->ctx,"ietf-netconf-with-defaults",(char *)0x0,1
                                     ), pmVar6 = local_40, plVar9 != (lys_module *)0x0)))) {
        modlist_add(&local_40,plVar9);
        pmVar6 = local_40;
      }
      goto joined_r0x00194e4c;
    }
  }
  else if ((int)LVar2 < 0x100) {
    if ((LVar2 != LYS_LIST) && (LVar2 != LYS_NOTIF)) goto joined_r0x00194e4c;
  }
  else if ((LVar2 != LYS_RPC) && (LVar2 != LYS_ACTION)) goto joined_r0x00194e4c;
  if (((((ulong)local_38 & 0xc0) == 0) ||
      (plVar9 = ly_ctx_get_module(plVar3->module->ctx,"ietf-netconf-with-defaults",(char *)0x0,1),
      plVar9 == (lys_module *)0x0)) ||
     (iVar8 = modlist_add(&local_40,plVar9), pmVar6 = local_40, iVar8 == 0)) {
    local_38 = node->child;
joined_r0x00194d52:
    plVar7 = local_38;
    pmVar6 = local_40;
    if (local_38 != (lyd_node *)0x0) {
      do {
        do {
          plVar10 = plVar7;
          for (plVar11 = plVar10->attr; plVar11 != (lyd_attr *)0x0; plVar11 = plVar11->next) {
            plVar3 = plVar10->schema;
            iVar8 = strcmp(plVar3->name,"filter");
            if (iVar8 == 0) {
              pcVar4 = plVar3->module->name;
              iVar8 = strcmp(pcVar4,"ietf-netconf");
              if ((iVar8 != 0) && (iVar8 = strcmp(pcVar4,"notifications"), iVar8 != 0))
              goto LAB_00194d82;
            }
            else {
LAB_00194d82:
              plVar9 = lys_main_module(plVar11->annotation->module);
              iVar8 = modlist_add(&local_40,plVar9);
              pmVar6 = local_40;
              if (iVar8 != 0) goto joined_r0x00194e4c;
            }
          }
        } while (((plVar10->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
                && (plVar7 = plVar10->child, plVar10->child != (lyd_node *)0x0));
        if (plVar10 == local_38) goto LAB_00194e30;
        plVar7 = plVar10->next;
        if (plVar10->next == (lyd_node *)0x0) {
          plVar10 = plVar10->parent;
          do {
            if (plVar10->parent == local_38->parent) goto LAB_00194e30;
            pplVar1 = &plVar10->next;
            plVar7 = *pplVar1;
            plVar10 = plVar10->parent;
          } while (*pplVar1 == (lyd_node *)0x0);
        }
      } while( true );
    }
  }
joined_r0x00194e4c:
  while (pmVar6 != (mlist *)0x0) {
    pmVar5 = pmVar6->next;
    ly_print(out," xmlns:%s=\"%s\"",pmVar6->module->prefix,pmVar6->module->ns);
    free(pmVar6);
    pmVar6 = pmVar5;
  }
  return;
LAB_00194e30:
  local_38 = local_38->next;
  goto joined_r0x00194d52;
}

Assistant:

static void
xml_print_ns(struct lyout *out, const struct lyd_node *node, int options)
{
    struct lyd_node *next, *cur, *node2;
    struct lyd_attr *attr;
    const struct lys_module *wdmod = NULL;
    struct mlist *mlist = NULL, *miter;
    int r;

    assert(out);
    assert(node);

    /* add node attribute modules */
    for (attr = node->attr; attr; attr = attr->next) {
        if (!strcmp(node->schema->name, "filter") &&
                (!strcmp(node->schema->module->name, "ietf-netconf") ||
                 !strcmp(node->schema->module->name, "notifications"))) {
            /* exception for NETCONF's filter attributes */
            continue;
        } else {
            r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
        }
        if (r) {
            goto print;
        }
    }

    /* add node children nodes and attribute modules */
    switch (node->schema->nodetype) {
    case LYS_LEAFLIST:
    case LYS_LEAF:
        if (node->dflt && (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG))) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }
        break;
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_RPC:
    case LYS_ACTION:
    case LYS_NOTIF:
        if (options & (LYP_WD_ALL_TAG | LYP_WD_IMPL_TAG)) {
            /* get with-defaults module and print its namespace */
            wdmod = ly_ctx_get_module(node->schema->module->ctx, "ietf-netconf-with-defaults", NULL, 1);
            if (wdmod && modlist_add(&mlist, wdmod)) {
                goto print;
            }
        }

        LY_TREE_FOR(node->child, node2) {
            LY_TREE_DFS_BEGIN(node2, next, cur) {
                for (attr = cur->attr; attr; attr = attr->next) {
                    if (!strcmp(cur->schema->name, "filter") &&
                            (!strcmp(cur->schema->module->name, "ietf-netconf") ||
                             !strcmp(cur->schema->module->name, "notifications"))) {
                        /* exception for NETCONF's filter attributes */
                        continue;
                    } else {
                        r = modlist_add(&mlist, lys_main_module(attr->annotation->module));
                    }
                    if (r) {
                        goto print;
                    }
                }
            LY_TREE_DFS_END(node2, next, cur)}
        }
        break;
    default:
        break;
    }

print:
    /* print used namespaces */
    while (mlist) {
        miter = mlist;
        mlist = mlist->next;

        ly_print(out, " xmlns:%s=\"%s\"", miter->module->prefix, miter->module->ns);
        free(miter);
    }
}